

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_Mesh * __thiscall ON_Mesh::DuplicateFace(ON_Mesh *this,int face_index,ON_Mesh *mesh)

{
  uint mesh_vertex_count;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  ON_3fPoint *V;
  ulong uVar10;
  ON_MeshFace *pOVar11;
  int vertex_count;
  uint uVar12;
  ulong uVar13;
  ON_3dPoint *V_00;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  ON_MeshFace f;
  ON_MeshFace local_78;
  ON_SimpleArray<ON_2fPoint> *local_68;
  ON_SimpleArray<ON_3fVector> *local_60;
  int local_58;
  int local_54;
  ON_SimpleArray<ON_3fPoint> *local_50;
  ON_SimpleArray<ON_3dPoint> *local_48;
  ulong local_40;
  ON_3fPoint *local_38;
  
  if (mesh == this) {
    return (ON_Mesh *)0x0;
  }
  uVar10 = (ulong)(uint)face_index;
  if (mesh != (ON_Mesh *)0x0) {
    Destroy(mesh);
  }
  if (face_index < 0) {
    return (ON_Mesh *)0x0;
  }
  if ((this->m_F).m_count <= face_index) {
    return (ON_Mesh *)0x0;
  }
  mesh_vertex_count = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (mesh_vertex_count < 3) {
    return (ON_Mesh *)0x0;
  }
  V_00 = (ON_3dPoint *)0x0;
  if (mesh_vertex_count == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
    V_00 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
  }
  iVar1 = (this->m_F).m_count;
  V = (ON_3fPoint *)0x0;
  if (mesh_vertex_count == (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
    V = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  }
  local_60 = (ON_SimpleArray<ON_3fVector> *)
             CONCAT71(local_60._1_7_,(this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar1
                     );
  bVar6 = 0 < (int)mesh_vertex_count;
  uVar2 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
  uVar3 = (this->m_C).m_count;
  uVar4 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
  uVar5 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
  bVar15 = (this->m_K).m_count == mesh_vertex_count;
  pOVar11 = (this->m_F).m_a + uVar10;
  local_78.vi._0_8_ = *(undefined8 *)pOVar11->vi;
  local_78.vi._8_8_ = *(undefined8 *)(pOVar11->vi + 2);
  if (V_00 == (ON_3dPoint *)0x0) {
    if (V == (ON_3fPoint *)0x0) {
      return (ON_Mesh *)0x0;
    }
    local_68 = (ON_SimpleArray<ON_2fPoint> *)CONCAT71(local_68._1_7_,bVar15);
    bVar15 = ON_MeshFace::IsValid(&local_78,mesh_vertex_count,V);
    if (bVar15) goto LAB_00515ae0;
    bVar15 = ON_MeshFace::Repair(&local_78,mesh_vertex_count,V);
  }
  else {
    local_68 = (ON_SimpleArray<ON_2fPoint> *)CONCAT71(local_68._1_7_,bVar15);
    bVar15 = ON_MeshFace::IsValid(&local_78,mesh_vertex_count,V_00);
    V = (ON_3fPoint *)0x0;
    if (bVar15) goto LAB_00515ae0;
    bVar15 = ON_MeshFace::Repair(&local_78,mesh_vertex_count,V_00);
  }
  if (bVar15 == false) {
    return (ON_Mesh *)0x0;
  }
LAB_00515ae0:
  iVar7 = local_78.vi[2];
  local_54 = local_78.vi[3];
  bVar15 = local_78.vi[2] != local_78.vi[3];
  local_40 = uVar10;
  local_38 = V;
  if (mesh == (ON_Mesh *)0x0) {
    mesh = (ON_Mesh *)operator_new(0x6e0);
    ON_Mesh(mesh);
  }
  uVar12 = bVar15 + 3;
  uVar10 = (ulong)uVar12;
  if (V_00 == (ON_3dPoint *)0x0) {
    local_48 = (ON_SimpleArray<ON_3dPoint> *)0x0;
  }
  else {
    local_48 = &(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>;
    if ((uint)(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar12) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity(local_48,uVar10);
    }
  }
  local_58 = iVar7;
  local_50 = &(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>;
  if ((uint)(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar12) {
    ON_SimpleArray<ON_3fPoint>::SetCapacity(local_50,uVar10);
  }
  bVar14 = 0 < iVar1 & (byte)local_60;
  if ((mesh->m_F).m_capacity == 0) {
    ON_SimpleArray<ON_MeshFace>::SetCapacity(&mesh->m_F,1);
  }
  bVar15 = uVar2 == mesh_vertex_count && bVar6;
  bVar16 = local_58 == local_54;
  pOVar11 = ON_SimpleArray<ON_MeshFace>::AppendNew(&mesh->m_F);
  pOVar11->vi[0] = 0;
  pOVar11->vi[1] = 1;
  pOVar11->vi[2] = 2;
  pOVar11->vi[3] = bVar16 ^ 3;
  if (bVar14 != 0) {
    if ((mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity == 0) {
      ON_SimpleArray<ON_3fVector>::SetCapacity(&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,1);
    }
    ON_SimpleArray<ON_3fVector>::Append
              (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,
               (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + local_40);
  }
  bVar16 = uVar4 == mesh_vertex_count && bVar6;
  if ((bVar15) && ((uint)(mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar12)) {
    ON_SimpleArray<ON_3fVector>::SetCapacity(&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,uVar10);
  }
  bVar8 = uVar3 == mesh_vertex_count && bVar6;
  if ((bVar16) && ((uint)(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar12)) {
    ON_SimpleArray<ON_2fPoint>::SetCapacity(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar10);
  }
  bVar9 = uVar5 == mesh_vertex_count && bVar6;
  if ((bVar8) && ((uint)(mesh->m_C).m_capacity < uVar12)) {
    ON_SimpleArray<ON_Color>::SetCapacity(&mesh->m_C,uVar10);
  }
  bVar14 = bVar6 & (byte)local_68;
  if ((bVar9) && ((uint)(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar12)) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity(&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,uVar10);
  }
  if ((bVar14 != 0) && ((uint)(mesh->m_K).m_capacity < uVar12)) {
    ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&mesh->m_K,uVar10);
  }
  local_60 = &(mesh->m_N).super_ON_SimpleArray<ON_3fVector>;
  local_68 = &(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>;
  uVar13 = 0;
  do {
    if (V_00 == (ON_3dPoint *)0x0) {
      ON_SimpleArray<ON_3fPoint>::Append(local_50,local_38 + local_78.vi[uVar13]);
    }
    else {
      ON_SimpleArray<ON_3dPoint>::Append(local_48,V_00 + local_78.vi[uVar13]);
    }
    if (bVar15) {
      ON_SimpleArray<ON_3fVector>::Append
                (local_60,(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + local_78.vi[uVar13]);
    }
    if (bVar16) {
      ON_SimpleArray<ON_2fPoint>::Append
                (local_68,(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + local_78.vi[uVar13]);
    }
    if (bVar8) {
      ON_SimpleArray<ON_Color>::Append(&mesh->m_C,(this->m_C).m_a + local_78.vi[uVar13]);
    }
    if (bVar9) {
      ON_SimpleArray<ON_2dPoint>::Append
                (&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,
                 (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a + local_78.vi[uVar13]);
    }
    if (bVar14 != 0) {
      ON_SimpleArray<ON_SurfaceCurvature>::Append(&mesh->m_K,(this->m_K).m_a + local_78.vi[uVar13]);
    }
    uVar13 = uVar13 + 1;
  } while (uVar10 != uVar13);
  if (V_00 != (ON_3dPoint *)0x0) {
    UpdateSinglePrecisionVertices(mesh);
    return mesh;
  }
  return mesh;
}

Assistant:

ON_Mesh* ON_Mesh::DuplicateFace( int face_index, ON_Mesh* mesh ) const
{
  if ( mesh == this )
    return nullptr;
  if ( 0 != mesh )
    mesh->Destroy();
  if ( face_index < 0 || face_index >= m_F.Count() )
    return nullptr;
  const unsigned int vcnt = VertexUnsignedCount();
  if ( vcnt < 3 )
    return nullptr;

  const ON_3dPoint* dV = ( vcnt == m_dV.UnsignedCount() ) ? m_dV.Array() : nullptr;
  const ON_3fPoint* fV = (nullptr == dV && vcnt == m_V.UnsignedCount() ) ? m_V.Array() : nullptr;
  bool bHasFaceNormals = HasFaceNormals();
  bool bHasVertexNormals = HasVertexNormals();
  bool bHasVertexColors = HasVertexColors();
  bool bHasTextureCoordinates = HasTextureCoordinates();
  bool bHasSurfaceParameters = HasSurfaceParameters();
  bool bHasPrincipalCurvatures = HasPrincipalCurvatures();

  ON_MeshFace f = m_F[face_index];
  if ( nullptr != dV )
  {
    if ( !f.IsValid(vcnt,dV) )
    {
      // invalid vertex indices - see if it can be fixed
      if ( !f.Repair(vcnt,dV) )
        return nullptr;
    }
  }
  else if (nullptr != fV)
  {
    if (!f.IsValid(vcnt, fV))
    {
      // invalid vertex indices - see if it can be fixed
      if (!f.Repair(vcnt, fV))
        return nullptr;
    }
  }
  else
    return nullptr;

  const int newvcnt = f.IsTriangle() ? 3 : 4;
  if ( 0 == mesh )
    mesh = new ON_Mesh();
  ON_3dPointArray* newdV = 0;
  if ( dV )
  {
    newdV = &mesh->m_dV;
    newdV->Reserve(newvcnt);
  }
  mesh->m_V.Reserve(newvcnt);
  mesh->m_F.Reserve(1);
  ON_MeshFace& newface = mesh->m_F.AppendNew();
  newface.vi[0] = 0;
  newface.vi[1] = 1;
  newface.vi[2] = 2;
  newface.vi[3] = (4 == newvcnt) ? 3 : newface.vi[2];

  if ( bHasFaceNormals )
  {
    mesh->m_FN.Reserve(1);
    mesh->m_FN.Append(m_FN[face_index]);
  }

  if ( bHasVertexNormals )
    mesh->m_N.Reserve(newvcnt);
  if ( bHasTextureCoordinates )
    mesh->m_T.Reserve(newvcnt);
  if ( bHasVertexColors )
    mesh->m_C.Reserve(newvcnt);
  if ( bHasSurfaceParameters )
    mesh->m_S.Reserve(newvcnt);
  if ( bHasPrincipalCurvatures )
    mesh->m_K.Reserve(newvcnt);
  for ( int vi = 0; vi < newvcnt; vi++ )
  {
    if ( dV )
      newdV->Append(dV[f.vi[vi]]);
    else
      mesh->m_V.Append(fV[f.vi[vi]]);
    if ( bHasVertexNormals )
      mesh->m_N.Append(m_N[f.vi[vi]]);
    if ( bHasTextureCoordinates )
      mesh->m_T.Append(m_T[f.vi[vi]]);
    if ( bHasVertexColors )
      mesh->m_C.Append(m_C[f.vi[vi]]);
    if ( bHasSurfaceParameters )
      mesh->m_S.Append(m_S[f.vi[vi]]);
    if ( bHasPrincipalCurvatures )
      mesh->m_K.Append(m_K[f.vi[vi]]);
  }
  if ( nullptr != dV )
    mesh->UpdateSinglePrecisionVertices();

  return mesh;
}